

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O1

void __thiscall glcts::anon_unknown_0::BasicAPIGet::~BasicAPIGet(BasicAPIGet *this)

{
  deqp::SubcaseBase::~SubcaseBase((SubcaseBase *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual long Run()
	{
		if (!CheckMax(GL_MAX_IMAGE_UNITS, 4))
		{
			Output("GL_MAX_IMAGE_UNITS value is invalid.\n");
			return ERROR;
		}
		if (!CheckMax(GL_MAX_COMBINED_SHADER_OUTPUT_RESOURCES, 4))
		{
			Output("GL_MAX_COMBINED_SHADER_OUTPUT_RESOURCES value is invalid.\n");
			return ERROR;
		}
		if (!CheckMax(GL_MAX_VERTEX_IMAGE_UNIFORMS, 0))
		{
			Output("GL_MAX_VERTEX_IMAGE_UNIFORMS value is invalid.\n");
			return ERROR;
		}
		if (!CheckMax(GL_MAX_FRAGMENT_IMAGE_UNIFORMS, 0))
		{
			Output("GL_MAX_FRAGMENT_IMAGE_UNIFORMS value is invalid.\n");
			return ERROR;
		}
		if (!CheckMax(GL_MAX_COMBINED_IMAGE_UNIFORMS, 4))
		{
			Output("GL_MAX_COMBINED_IMAGE_UNIFORMS value is invalid.\n");
			return ERROR;
		}
		if (!CheckMax(GL_MAX_COMPUTE_IMAGE_UNIFORMS, 4))
		{
			Output("GL_MAX_COMPUTE_IMAGE_UNIFORMS value is invalid.\n");
			return ERROR;
		}
		return NO_ERROR;
	}